

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_MeshPart>::Append(ON_SimpleArray<ON_MeshPart> *this,ON_MeshPart *x)

{
  int iVar1;
  int iVar2;
  ON_MeshPart *pOVar3;
  void *temp;
  ON_MeshPart *pOStack_20;
  int newcapacity;
  ON_MeshPart *p;
  ON_MeshPart *x_local;
  ON_SimpleArray<ON_MeshPart> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar2 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_MeshPart *)onmalloc(0x18);
      *(undefined8 *)pOStack_20->vi = *(undefined8 *)x->vi;
      *(undefined8 *)pOStack_20->fi = *(undefined8 *)x->fi;
      iVar1 = x->triangle_count;
      pOStack_20->vertex_count = x->vertex_count;
      pOStack_20->triangle_count = iVar1;
    }
    Reserve(this,(long)iVar2);
    if (this->m_a == (ON_MeshPart *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  pOVar3 = this->m_a + iVar2;
  *(undefined8 *)pOVar3->vi = *(undefined8 *)pOStack_20->vi;
  *(undefined8 *)pOVar3->fi = *(undefined8 *)pOStack_20->fi;
  iVar2 = pOStack_20->triangle_count;
  pOVar3->vertex_count = pOStack_20->vertex_count;
  pOVar3->triangle_count = iVar2;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}